

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O3

Page * __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
AddPageToBucket(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
               Page *page,BucketId bucket,bool wasFull)

{
  BucketId BVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (6 < (uint)bucket) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                       ,0x2db,"(bucket > BucketId::InvalidBucket && bucket < BucketId::NumBuckets)",
                       "bucket > BucketId::InvalidBucket && bucket < BucketId::NumBuckets");
    if (!bVar3) goto LAB_006a08a4;
    *puVar4 = 0;
  }
  BVar1 = page->currentBucket;
  page->currentBucket = bucket;
  if (wasFull) {
    if (page->inFullList == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                         ,0x2e3,"(page->inFullList)","page->inFullList");
      if (!bVar3) {
LAB_006a08a4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
              (this->fullPages + BVar1,page,this->buckets + bucket);
    page->inFullList = false;
  }
  else {
    if (page->inFullList != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/CustomHeap.cpp"
                         ,0x2e9,"(!page->inFullList)","!page->inFullList");
      if (!bVar3) goto LAB_006a08a4;
      *puVar4 = 0;
    }
    DListBase<Memory::CustomHeap::Page,_RealCount>::MoveElementTo
              (this->buckets + BVar1,page,this->buckets + bucket);
  }
  return page;
}

Assistant:

Page* Heap<TAlloc, TPreReservedAlloc>::AddPageToBucket(Page* page, BucketId bucket, bool wasFull)
{
    Assert(bucket > BucketId::InvalidBucket && bucket < BucketId::NumBuckets);

    BucketId oldBucket = page->currentBucket;

    page->currentBucket = bucket;
    if (wasFull)
    {
        #pragma prefast(suppress: __WARNING_UNCHECKED_LOWER_BOUND_FOR_ENUMINDEX, "targetBucket is always in range >= SmallObjectList, but an __in_range doesn't fix the warning.");
        Assert(page->inFullList);
        this->fullPages[oldBucket].MoveElementTo(page, &this->buckets[bucket]);
        page->inFullList = false;
    }
    else
    {
        Assert(!page->inFullList);
        #pragma prefast(suppress: __WARNING_UNCHECKED_LOWER_BOUND_FOR_ENUMINDEX, "targetBucket is always in range >= SmallObjectList, but an __in_range doesn't fix the warning.");
        this->buckets[oldBucket].MoveElementTo(page, &this->buckets[bucket]);
    }

    return page;
}